

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O3

char * amqp_method_name(amqp_method_number_t methodNumber)

{
  if ((int)methodNumber < 0x320015) {
    if ((int)methodNumber < 0x140014) {
      if ((int)methodNumber < 0xa0032) {
        if ((int)methodNumber < 0xa001e) {
          if ((int)methodNumber < 0xa0014) {
            if (methodNumber == 0xa000a) {
              return "AMQP_CONNECTION_START_METHOD";
            }
            if (methodNumber == 0xa000b) {
              return "AMQP_CONNECTION_START_OK_METHOD";
            }
          }
          else {
            if (methodNumber == 0xa0014) {
              return "AMQP_CONNECTION_SECURE_METHOD";
            }
            if (methodNumber == 0xa0015) {
              return "AMQP_CONNECTION_SECURE_OK_METHOD";
            }
          }
        }
        else if ((int)methodNumber < 0xa0028) {
          if (methodNumber == 0xa001e) {
            return "AMQP_CONNECTION_TUNE_METHOD";
          }
          if (methodNumber == 0xa001f) {
            return "AMQP_CONNECTION_TUNE_OK_METHOD";
          }
        }
        else {
          if (methodNumber == 0xa0028) {
            return "AMQP_CONNECTION_OPEN_METHOD";
          }
          if (methodNumber == 0xa0029) {
            return "AMQP_CONNECTION_OPEN_OK_METHOD";
          }
        }
      }
      else if ((int)methodNumber < 0xa0046) {
        if ((int)methodNumber < 0xa003c) {
          if (methodNumber == 0xa0032) {
            return "AMQP_CONNECTION_CLOSE_METHOD";
          }
          if (methodNumber == 0xa0033) {
            return "AMQP_CONNECTION_CLOSE_OK_METHOD";
          }
        }
        else {
          if (methodNumber == 0xa003c) {
            return "AMQP_CONNECTION_BLOCKED_METHOD";
          }
          if (methodNumber == 0xa003d) {
            return "AMQP_CONNECTION_UNBLOCKED_METHOD";
          }
        }
      }
      else if ((int)methodNumber < 0x14000a) {
        if (methodNumber == 0xa0046) {
          return "AMQP_CONNECTION_UPDATE_SECRET_METHOD";
        }
        if (methodNumber == 0xa0047) {
          return "AMQP_CONNECTION_UPDATE_SECRET_OK_METHOD";
        }
      }
      else {
        if (methodNumber == 0x14000a) {
          return "AMQP_CHANNEL_OPEN_METHOD";
        }
        if (methodNumber == 0x14000b) {
          return "AMQP_CHANNEL_OPEN_OK_METHOD";
        }
      }
    }
    else if ((int)methodNumber < 0x280014) {
      if ((int)methodNumber < 0x1e000a) {
        if ((int)methodNumber < 0x140028) {
          if (methodNumber == 0x140014) {
            return "AMQP_CHANNEL_FLOW_METHOD";
          }
          if (methodNumber == 0x140015) {
            return "AMQP_CHANNEL_FLOW_OK_METHOD";
          }
        }
        else {
          if (methodNumber == 0x140028) {
            return "AMQP_CHANNEL_CLOSE_METHOD";
          }
          if (methodNumber == 0x140029) {
            return "AMQP_CHANNEL_CLOSE_OK_METHOD";
          }
        }
      }
      else if ((int)methodNumber < 0x28000a) {
        if (methodNumber == 0x1e000a) {
          return "AMQP_ACCESS_REQUEST_METHOD";
        }
        if (methodNumber == 0x1e000b) {
          return "AMQP_ACCESS_REQUEST_OK_METHOD";
        }
      }
      else {
        if (methodNumber == 0x28000a) {
          return "AMQP_EXCHANGE_DECLARE_METHOD";
        }
        if (methodNumber == 0x28000b) {
          return "AMQP_EXCHANGE_DECLARE_OK_METHOD";
        }
      }
    }
    else if ((int)methodNumber < 0x280028) {
      if ((int)methodNumber < 0x28001e) {
        if (methodNumber == 0x280014) {
          return "AMQP_EXCHANGE_DELETE_METHOD";
        }
        if (methodNumber == 0x280015) {
          return "AMQP_EXCHANGE_DELETE_OK_METHOD";
        }
      }
      else {
        if (methodNumber == 0x28001e) {
          return "AMQP_EXCHANGE_BIND_METHOD";
        }
        if (methodNumber == 0x28001f) {
          return "AMQP_EXCHANGE_BIND_OK_METHOD";
        }
      }
    }
    else if ((int)methodNumber < 0x32000a) {
      if (methodNumber == 0x280028) {
        return "AMQP_EXCHANGE_UNBIND_METHOD";
      }
      if (methodNumber == 0x280033) {
        return "AMQP_EXCHANGE_UNBIND_OK_METHOD";
      }
    }
    else {
      if (methodNumber == 0x32000a) {
        return "AMQP_QUEUE_DECLARE_METHOD";
      }
      if (methodNumber == 0x32000b) {
        return "AMQP_QUEUE_DECLARE_OK_METHOD";
      }
      if (methodNumber == 0x320014) {
        return "AMQP_QUEUE_BIND_METHOD";
      }
    }
  }
  else if ((int)methodNumber < 0x3c0046) {
    if ((int)methodNumber < 0x3c000b) {
      if ((int)methodNumber < 0x320029) {
        if ((int)methodNumber < 0x32001f) {
          if (methodNumber == 0x320015) {
            return "AMQP_QUEUE_BIND_OK_METHOD";
          }
          if (methodNumber == 0x32001e) {
            return "AMQP_QUEUE_PURGE_METHOD";
          }
        }
        else {
          if (methodNumber == 0x32001f) {
            return "AMQP_QUEUE_PURGE_OK_METHOD";
          }
          if (methodNumber == 0x320028) {
            return "AMQP_QUEUE_DELETE_METHOD";
          }
        }
      }
      else if ((int)methodNumber < 0x320033) {
        if (methodNumber == 0x320029) {
          return "AMQP_QUEUE_DELETE_OK_METHOD";
        }
        if (methodNumber == 0x320032) {
          return "AMQP_QUEUE_UNBIND_METHOD";
        }
      }
      else {
        if (methodNumber == 0x320033) {
          return "AMQP_QUEUE_UNBIND_OK_METHOD";
        }
        if (methodNumber == 0x3c000a) {
          return "AMQP_BASIC_QOS_METHOD";
        }
      }
    }
    else if ((int)methodNumber < 0x3c001f) {
      if ((int)methodNumber < 0x3c0015) {
        if (methodNumber == 0x3c000b) {
          return "AMQP_BASIC_QOS_OK_METHOD";
        }
        if (methodNumber == 0x3c0014) {
          return "AMQP_BASIC_CONSUME_METHOD";
        }
      }
      else {
        if (methodNumber == 0x3c0015) {
          return "AMQP_BASIC_CONSUME_OK_METHOD";
        }
        if (methodNumber == 0x3c001e) {
          return "AMQP_BASIC_CANCEL_METHOD";
        }
      }
    }
    else if ((int)methodNumber < 0x3c0032) {
      if (methodNumber == 0x3c001f) {
        return "AMQP_BASIC_CANCEL_OK_METHOD";
      }
      if (methodNumber == 0x3c0028) {
        return "AMQP_BASIC_PUBLISH_METHOD";
      }
    }
    else {
      if (methodNumber == 0x3c0032) {
        return "AMQP_BASIC_RETURN_METHOD";
      }
      if (methodNumber == 0x3c003c) {
        return "AMQP_BASIC_DELIVER_METHOD";
      }
    }
  }
  else if ((int)methodNumber < 0x3c0078) {
    if ((int)methodNumber < 0x3c005a) {
      if ((int)methodNumber < 0x3c0048) {
        if (methodNumber == 0x3c0046) {
          return "AMQP_BASIC_GET_METHOD";
        }
        if (methodNumber == 0x3c0047) {
          return "AMQP_BASIC_GET_OK_METHOD";
        }
      }
      else {
        if (methodNumber == 0x3c0048) {
          return "AMQP_BASIC_GET_EMPTY_METHOD";
        }
        if (methodNumber == 0x3c0050) {
          return "AMQP_BASIC_ACK_METHOD";
        }
      }
    }
    else if ((int)methodNumber < 0x3c006e) {
      if (methodNumber == 0x3c005a) {
        return "AMQP_BASIC_REJECT_METHOD";
      }
      if (methodNumber == 0x3c0064) {
        return "AMQP_BASIC_RECOVER_ASYNC_METHOD";
      }
    }
    else {
      if (methodNumber == 0x3c006e) {
        return "AMQP_BASIC_RECOVER_METHOD";
      }
      if (methodNumber == 0x3c006f) {
        return "AMQP_BASIC_RECOVER_OK_METHOD";
      }
    }
  }
  else if ((int)methodNumber < 0x5a000b) {
    if ((int)methodNumber < 0x55000b) {
      if (methodNumber == 0x3c0078) {
        return "AMQP_BASIC_NACK_METHOD";
      }
      if (methodNumber == 0x55000a) {
        return "AMQP_CONFIRM_SELECT_METHOD";
      }
    }
    else {
      if (methodNumber == 0x55000b) {
        return "AMQP_CONFIRM_SELECT_OK_METHOD";
      }
      if (methodNumber == 0x5a000a) {
        return "AMQP_TX_SELECT_METHOD";
      }
    }
  }
  else if ((int)methodNumber < 0x5a0015) {
    if (methodNumber == 0x5a000b) {
      return "AMQP_TX_SELECT_OK_METHOD";
    }
    if (methodNumber == 0x5a0014) {
      return "AMQP_TX_COMMIT_METHOD";
    }
  }
  else {
    if (methodNumber == 0x5a0015) {
      return "AMQP_TX_COMMIT_OK_METHOD";
    }
    if (methodNumber == 0x5a001e) {
      return "AMQP_TX_ROLLBACK_METHOD";
    }
    if (methodNumber == 0x5a001f) {
      return "AMQP_TX_ROLLBACK_OK_METHOD";
    }
  }
  return (char *)0x0;
}

Assistant:

char const *amqp_method_name(amqp_method_number_t methodNumber) {
  switch (methodNumber) {
    case AMQP_CONNECTION_START_METHOD:
      return "AMQP_CONNECTION_START_METHOD";
    case AMQP_CONNECTION_START_OK_METHOD:
      return "AMQP_CONNECTION_START_OK_METHOD";
    case AMQP_CONNECTION_SECURE_METHOD:
      return "AMQP_CONNECTION_SECURE_METHOD";
    case AMQP_CONNECTION_SECURE_OK_METHOD:
      return "AMQP_CONNECTION_SECURE_OK_METHOD";
    case AMQP_CONNECTION_TUNE_METHOD:
      return "AMQP_CONNECTION_TUNE_METHOD";
    case AMQP_CONNECTION_TUNE_OK_METHOD:
      return "AMQP_CONNECTION_TUNE_OK_METHOD";
    case AMQP_CONNECTION_OPEN_METHOD:
      return "AMQP_CONNECTION_OPEN_METHOD";
    case AMQP_CONNECTION_OPEN_OK_METHOD:
      return "AMQP_CONNECTION_OPEN_OK_METHOD";
    case AMQP_CONNECTION_CLOSE_METHOD:
      return "AMQP_CONNECTION_CLOSE_METHOD";
    case AMQP_CONNECTION_CLOSE_OK_METHOD:
      return "AMQP_CONNECTION_CLOSE_OK_METHOD";
    case AMQP_CONNECTION_BLOCKED_METHOD:
      return "AMQP_CONNECTION_BLOCKED_METHOD";
    case AMQP_CONNECTION_UNBLOCKED_METHOD:
      return "AMQP_CONNECTION_UNBLOCKED_METHOD";
    case AMQP_CONNECTION_UPDATE_SECRET_METHOD:
      return "AMQP_CONNECTION_UPDATE_SECRET_METHOD";
    case AMQP_CONNECTION_UPDATE_SECRET_OK_METHOD:
      return "AMQP_CONNECTION_UPDATE_SECRET_OK_METHOD";
    case AMQP_CHANNEL_OPEN_METHOD:
      return "AMQP_CHANNEL_OPEN_METHOD";
    case AMQP_CHANNEL_OPEN_OK_METHOD:
      return "AMQP_CHANNEL_OPEN_OK_METHOD";
    case AMQP_CHANNEL_FLOW_METHOD:
      return "AMQP_CHANNEL_FLOW_METHOD";
    case AMQP_CHANNEL_FLOW_OK_METHOD:
      return "AMQP_CHANNEL_FLOW_OK_METHOD";
    case AMQP_CHANNEL_CLOSE_METHOD:
      return "AMQP_CHANNEL_CLOSE_METHOD";
    case AMQP_CHANNEL_CLOSE_OK_METHOD:
      return "AMQP_CHANNEL_CLOSE_OK_METHOD";
    case AMQP_ACCESS_REQUEST_METHOD:
      return "AMQP_ACCESS_REQUEST_METHOD";
    case AMQP_ACCESS_REQUEST_OK_METHOD:
      return "AMQP_ACCESS_REQUEST_OK_METHOD";
    case AMQP_EXCHANGE_DECLARE_METHOD:
      return "AMQP_EXCHANGE_DECLARE_METHOD";
    case AMQP_EXCHANGE_DECLARE_OK_METHOD:
      return "AMQP_EXCHANGE_DECLARE_OK_METHOD";
    case AMQP_EXCHANGE_DELETE_METHOD:
      return "AMQP_EXCHANGE_DELETE_METHOD";
    case AMQP_EXCHANGE_DELETE_OK_METHOD:
      return "AMQP_EXCHANGE_DELETE_OK_METHOD";
    case AMQP_EXCHANGE_BIND_METHOD:
      return "AMQP_EXCHANGE_BIND_METHOD";
    case AMQP_EXCHANGE_BIND_OK_METHOD:
      return "AMQP_EXCHANGE_BIND_OK_METHOD";
    case AMQP_EXCHANGE_UNBIND_METHOD:
      return "AMQP_EXCHANGE_UNBIND_METHOD";
    case AMQP_EXCHANGE_UNBIND_OK_METHOD:
      return "AMQP_EXCHANGE_UNBIND_OK_METHOD";
    case AMQP_QUEUE_DECLARE_METHOD:
      return "AMQP_QUEUE_DECLARE_METHOD";
    case AMQP_QUEUE_DECLARE_OK_METHOD:
      return "AMQP_QUEUE_DECLARE_OK_METHOD";
    case AMQP_QUEUE_BIND_METHOD:
      return "AMQP_QUEUE_BIND_METHOD";
    case AMQP_QUEUE_BIND_OK_METHOD:
      return "AMQP_QUEUE_BIND_OK_METHOD";
    case AMQP_QUEUE_PURGE_METHOD:
      return "AMQP_QUEUE_PURGE_METHOD";
    case AMQP_QUEUE_PURGE_OK_METHOD:
      return "AMQP_QUEUE_PURGE_OK_METHOD";
    case AMQP_QUEUE_DELETE_METHOD:
      return "AMQP_QUEUE_DELETE_METHOD";
    case AMQP_QUEUE_DELETE_OK_METHOD:
      return "AMQP_QUEUE_DELETE_OK_METHOD";
    case AMQP_QUEUE_UNBIND_METHOD:
      return "AMQP_QUEUE_UNBIND_METHOD";
    case AMQP_QUEUE_UNBIND_OK_METHOD:
      return "AMQP_QUEUE_UNBIND_OK_METHOD";
    case AMQP_BASIC_QOS_METHOD:
      return "AMQP_BASIC_QOS_METHOD";
    case AMQP_BASIC_QOS_OK_METHOD:
      return "AMQP_BASIC_QOS_OK_METHOD";
    case AMQP_BASIC_CONSUME_METHOD:
      return "AMQP_BASIC_CONSUME_METHOD";
    case AMQP_BASIC_CONSUME_OK_METHOD:
      return "AMQP_BASIC_CONSUME_OK_METHOD";
    case AMQP_BASIC_CANCEL_METHOD:
      return "AMQP_BASIC_CANCEL_METHOD";
    case AMQP_BASIC_CANCEL_OK_METHOD:
      return "AMQP_BASIC_CANCEL_OK_METHOD";
    case AMQP_BASIC_PUBLISH_METHOD:
      return "AMQP_BASIC_PUBLISH_METHOD";
    case AMQP_BASIC_RETURN_METHOD:
      return "AMQP_BASIC_RETURN_METHOD";
    case AMQP_BASIC_DELIVER_METHOD:
      return "AMQP_BASIC_DELIVER_METHOD";
    case AMQP_BASIC_GET_METHOD:
      return "AMQP_BASIC_GET_METHOD";
    case AMQP_BASIC_GET_OK_METHOD:
      return "AMQP_BASIC_GET_OK_METHOD";
    case AMQP_BASIC_GET_EMPTY_METHOD:
      return "AMQP_BASIC_GET_EMPTY_METHOD";
    case AMQP_BASIC_ACK_METHOD:
      return "AMQP_BASIC_ACK_METHOD";
    case AMQP_BASIC_REJECT_METHOD:
      return "AMQP_BASIC_REJECT_METHOD";
    case AMQP_BASIC_RECOVER_ASYNC_METHOD:
      return "AMQP_BASIC_RECOVER_ASYNC_METHOD";
    case AMQP_BASIC_RECOVER_METHOD:
      return "AMQP_BASIC_RECOVER_METHOD";
    case AMQP_BASIC_RECOVER_OK_METHOD:
      return "AMQP_BASIC_RECOVER_OK_METHOD";
    case AMQP_BASIC_NACK_METHOD:
      return "AMQP_BASIC_NACK_METHOD";
    case AMQP_TX_SELECT_METHOD:
      return "AMQP_TX_SELECT_METHOD";
    case AMQP_TX_SELECT_OK_METHOD:
      return "AMQP_TX_SELECT_OK_METHOD";
    case AMQP_TX_COMMIT_METHOD:
      return "AMQP_TX_COMMIT_METHOD";
    case AMQP_TX_COMMIT_OK_METHOD:
      return "AMQP_TX_COMMIT_OK_METHOD";
    case AMQP_TX_ROLLBACK_METHOD:
      return "AMQP_TX_ROLLBACK_METHOD";
    case AMQP_TX_ROLLBACK_OK_METHOD:
      return "AMQP_TX_ROLLBACK_OK_METHOD";
    case AMQP_CONFIRM_SELECT_METHOD:
      return "AMQP_CONFIRM_SELECT_METHOD";
    case AMQP_CONFIRM_SELECT_OK_METHOD:
      return "AMQP_CONFIRM_SELECT_OK_METHOD";
    default:
      return NULL;
  }
}